

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

const_iterator __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
::find_impl<std::__cxx11::wstring>
          (robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
           *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *key,
          size_t hash)

{
  __type _Var1;
  long lVar2;
  short sVar3;
  ulong uVar4;
  
  uVar4 = hash & *(ulong *)this;
  sVar3 = 0;
  while( true ) {
    lVar2 = uVar4 * 0x30;
    if (*(short *)(*(long *)(this + 8) + 4 + lVar2) < sVar3) {
      return (const_iterator)
             (iterator_bucket)
             *(bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
               **)(this + 0x10);
    }
    _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(*(long *)(this + 8) + lVar2 + 8),key);
    if (_Var1) break;
    uVar4 = uVar4 + 1 & *(ulong *)this;
    sVar3 = sVar3 + 1;
  }
  return (const_iterator)
         (bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
          *)(lVar2 + *(long *)(this + 8));
}

Assistant:

const_iterator find_impl(const K& key, std::size_t hash) const {
        std::size_t ibucket = bucket_for_hash(hash); 
        distance_type dist_from_ideal_bucket = 0;
        
        while(dist_from_ideal_bucket <= m_buckets[ibucket].dist_from_ideal_bucket()) {
            if((!USE_STORED_HASH_ON_LOOKUP || m_buckets[ibucket].bucket_hash_equal(hash)) && 
               compare_keys(KeySelect()(m_buckets[ibucket].value()), key)) 
            {
                return const_iterator(m_buckets.begin() + ibucket);
            }
            
            ibucket = next_bucket(ibucket);
            dist_from_ideal_bucket++;
        }
        
        return cend();
    }